

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadFunctions.cpp
# Opt level: O2

void __thiscall
Producer::operator()(Producer *this,Queue<int> *q,TimeT startTime,TimeT period,int noMessages)

{
  int local_3c;
  TimeT period_local;
  TimeT startTime_local;
  
  period_local = period;
  startTime_local = startTime;
  std::chrono::_V2::system_clock::now();
  std::vector<int,_std::allocator<int>_>::reserve(&this->producedValues,200);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&startTime_local);
  for (local_3c = 1; local_3c <= noMessages; local_3c = local_3c + 1) {
    rtb::Concurrency::Queue<int>::push(q,&local_3c);
    std::vector<int,_std::allocator<int>_>::push_back(&this->producedValues,&local_3c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&period_local);
  }
  local_3c = 0x7fffffff;
  rtb::Concurrency::Queue<int>::push(q,&local_3c);
  return;
}

Assistant:

void Producer::operator()(Queue<int> &q, TimeT startTime, TimeT period, int noMessages) {
    auto start = std::chrono::system_clock::now();
    producedValues.reserve(200);
    std::this_thread::sleep_for(startTime);

    for (int i = 1; i <= noMessages; ++i) {
        q.push(i);
        producedValues.push_back(i);
        std::this_thread::sleep_for(period);
    }
    q.push(std::numeric_limits<int>::max());
}